

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_reader.cc
# Opt level: O2

bool __thiscall xsettingsd::DataReader::ReadBytes(DataReader *this,string *out,size_t size)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  bool bVar4;
  
  uVar1 = this->bytes_read_;
  uVar3 = uVar1 + size;
  bVar2 = uVar3 <= this->buf_len_;
  bVar4 = uVar1 <= uVar3;
  if (bVar4 && bVar2) {
    if (out != (string *)0x0) {
      std::__cxx11::string::assign((char *)out,(ulong)(this->buffer_ + uVar1));
      uVar3 = size + this->bytes_read_;
    }
    this->bytes_read_ = uVar3;
  }
  return bVar4 && bVar2;
}

Assistant:

bool DataReader::ReadBytes(string* out, size_t size) {
  if (bytes_read_ + size > buf_len_ ||
      bytes_read_ + size < bytes_read_) {
    return false;
  }
  if (out)
    out->assign(buffer_ + bytes_read_, size);
  bytes_read_ += size;
  return true;
}